

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QString,_int>_>::rehash
          (Data<QHashPrivate::Node<QString,_int>_> *this,size_t sizeHint)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  size_t sVar5;
  void *pvVar6;
  long lVar7;
  long in_RDI;
  long in_FS_OFFSET;
  R_conflict7 RVar8;
  Node<QString,_int> *newNode;
  Node<QString,_int> *n;
  size_t index;
  Span *span;
  size_t s;
  size_t oldNSpans;
  size_t oldBucketCount;
  Span *oldSpans;
  size_t newBucketCount;
  Bucket it;
  Node<QString,_int> *in_stack_ffffffffffffff48;
  Span<QHashPrivate::Node<QString,_int>_> *in_stack_ffffffffffffff50;
  QString *in_stack_ffffffffffffff58;
  Data<QHashPrivate::Node<QString,_int>_> *in_stack_ffffffffffffff60;
  long lVar9;
  Span<QHashPrivate::Node<QString,_int>_> *in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff90;
  ulong i;
  ulong local_60;
  Span *local_50;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar5 = GrowthPolicy::bucketsForCapacity((size_t)in_stack_ffffffffffffff48);
  lVar2 = *(long *)(in_RDI + 0x20);
  uVar3 = *(ulong *)(in_RDI + 0x10);
  RVar8 = allocateSpans(in_stack_ffffffffffffff90);
  local_50 = RVar8.spans;
  *(Span **)(in_RDI + 0x20) = local_50;
  *(size_t *)(in_RDI + 0x10) = sVar5;
  for (local_60 = 0; local_60 < uVar3 >> 7; local_60 = local_60 + 1) {
    for (i = 0; i < 0x80; i = i + 1) {
      bVar4 = Span<QHashPrivate::Node<QString,_int>_>::hasNode
                        ((Span<QHashPrivate::Node<QString,_int>_> *)(lVar2 + local_60 * 0x90),i);
      if (bVar4) {
        Span<QHashPrivate::Node<QString,_int>_>::at
                  (in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48);
        findBucket<QString>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        in_stack_ffffffffffffff80 =
             (Span<QHashPrivate::Node<QString,_int>_> *)Bucket::insert((Bucket *)0x787567);
        Node<QString,_int>::Node
                  ((Node<QString,_int> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      }
    }
    Span<QHashPrivate::Node<QString,_int>_>::freeData(in_stack_ffffffffffffff80);
  }
  if (lVar2 != 0) {
    pvVar6 = (void *)(lVar2 + -8);
    lVar9 = *(long *)(lVar2 + -8);
    lVar7 = lVar2 + lVar9 * 0x90;
    while (lVar2 != lVar7) {
      lVar7 = lVar7 + -0x90;
      Span<QHashPrivate::Node<QString,_int>_>::~Span
                ((Span<QHashPrivate::Node<QString,_int>_> *)0x787605);
    }
    operator_delete__(pvVar6,lVar9 * 0x90 + 8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }